

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall BN::operator-=(BN *this,BN *bn)

{
  pointer puVar1;
  unsigned_short uVar2;
  ulong uVar3;
  ulong uVar4;
  pointer puVar5;
  pointer puVar6;
  ulong uVar7;
  uint uVar8;
  
  puVar5 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar5;
  puVar6 = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)puVar6;
  if (uVar3 < uVar7) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,(long)uVar7 >> 1)
    ;
    puVar6 = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar6;
    uVar3 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar5;
  }
  uVar4 = (long)uVar3 >> 1;
  if ((ulong)((long)uVar7 >> 1) <= (ulong)((long)uVar3 >> 1)) {
    uVar4 = (long)uVar7 >> 1;
  }
  uVar8 = 0;
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    uVar8 = (uint)puVar5[uVar3] - (uVar8 + puVar6[uVar3]);
    puVar5[uVar3] = (unsigned_short)uVar8;
    uVar8 = uVar8 >> 0x1f;
  }
  puVar5 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (; (uVar8 != 0 && (uVar4 < (ulong)((long)puVar6 - (long)puVar5 >> 1))); uVar4 = uVar4 + 1) {
    puVar1 = puVar5 + uVar4;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 - 1;
    if (uVar2 != 0) {
      uVar8 = 0;
    }
  }
  anon_unknown.dwarf_1add5::Norm(&this->ba);
  return this;
}

Assistant:

BN& BN::operator -= (const BN& bn)
{
    if (ba.size() < bn.ba.size())
        ba.resize(bn.ba.size());

    bool flag = 0;
    size_t pos = 0;

    for (; pos < bn.ba.size() && pos < ba.size(); ++pos) {
        bt2s res = static_cast<bt2s>(ba[pos]) - bn.ba[pos] - flag;
        ba[pos] = static_cast<bt>(res);
        flag = (res < 0);
    }

    for (; flag && pos < ba.size(); ++pos) {
        if (ba[pos])
            flag = false;
        --ba[pos];
    }

    Norm(ba);
    return *this;
}